

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O0

bool checkExecutable(QString *candidate,QString *result)

{
  bool bVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *this;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QString>::QList((QList<QString> *)0xacc5d5);
  this = &local_20;
  QStandardPaths::findExecutable((QString *)this,(QList_conflict3 *)in_RDI);
  QString::operator=(this,in_RDI);
  QString::~QString((QString *)0xacc606);
  QList<QString>::~QList((QList<QString> *)0xacc610);
  bVar1 = QString::isEmpty((QString *)0xacc61a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return !bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static inline bool checkExecutable(const QString &candidate, QString *result)
{
    *result = QStandardPaths::findExecutable(candidate);
    return !result->isEmpty();
}